

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtReadHex(word *pTruth,char *pString)

{
  int iVar1;
  word wVar2;
  int local_3c;
  word local_38;
  uint local_30;
  int nDigits;
  int Digit;
  int nVars;
  int k;
  char *pString_local;
  word *pTruth_local;
  
  _nVars = pString;
  if ((*pString == '0') && (pString[1] == 'x')) {
    _nVars = pString + 2;
  }
  local_30 = 0;
  Digit = 0;
  while (iVar1 = Abc_TtIsHexDigit(_nVars[Digit]), iVar1 != 0) {
    local_30 = local_30 + 1;
    Digit = Digit + 1;
  }
  if (local_30 == 1) {
    if ((*_nVars == '0') || (*_nVars == 'F')) {
      wVar2 = 0xffffffffffffffff;
      if (*_nVars == '0') {
        wVar2 = 0;
      }
      *pTruth = wVar2;
      return 0;
    }
    if ((*_nVars == '5') || (*_nVars == 'A')) {
      if (*_nVars == '5') {
        local_38 = s_Truths6Neg[0];
      }
      else {
        local_38 = s_Truths6[0];
      }
      *pTruth = local_38;
      return 1;
    }
  }
  if (local_30 == 1) {
    local_3c = 0;
  }
  else {
    local_3c = Abc_Base2Log(local_30);
  }
  local_3c = local_3c + 2;
  Digit = Abc_TtWordNum(local_3c);
  while (Digit = Digit + -1, -1 < Digit) {
    pTruth[Digit] = 0;
  }
  Digit = 0;
  while( true ) {
    if ((int)local_30 <= Digit) {
      if (local_3c < 6) {
        wVar2 = Abc_Tt6Stretch(*pTruth,local_3c);
        *pTruth = wVar2;
      }
      return local_3c;
    }
    iVar1 = Abc_TtReadHexDigit(_nVars[(int)((local_30 - 1) - Digit)]);
    if ((iVar1 < 0) || (0xf < iVar1)) break;
    Abc_TtSetHex(pTruth,Digit,iVar1);
    Digit = Digit + 1;
  }
  __assert_fail("Digit >= 0 && Digit < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                ,0x52a,"int Abc_TtReadHex(word *, char *)");
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + (nDigits == 1 ? 0 : Abc_Base2Log(nDigits));
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}